

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O3

void __thiscall cmCoreTryCompile::CleanupFiles(cmCoreTryCompile *this,char *binDir)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  size_t sVar3;
  long lVar4;
  unsigned_long uVar5;
  char *pcVar6;
  iterator iVar7;
  ulong dindex;
  Directory dir;
  string fullPath;
  string m;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  deletedFiles;
  string bdir;
  Directory local_d0;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  _Base_ptr local_68;
  size_t local_60;
  cmCoreTryCompile *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  if (binDir != (char *)0x0) {
    local_50[0] = local_40;
    local_58 = this;
    sVar3 = strlen(binDir);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,binDir,binDir + sVar3);
    lVar4 = std::__cxx11::string::find((char *)local_50,0x5a1d67,0);
    if (lVar4 == -1) {
      cmSystemTools::Error
                ("TRY_COMPILE attempt to remove -rf directory that does not contain CMakeTmp:",
                 binDir,(char *)0x0,(char *)0x0);
    }
    else {
      cmsys::Directory::Directory(&local_d0);
      local_88._0_8_ = local_88 + 0x10;
      sVar3 = strlen(binDir);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_88,binDir,binDir + sVar3);
      cmsys::Directory::Load(&local_d0,(string *)local_88);
      if ((undefined1 *)local_88._0_8_ != local_88 + 0x10) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      local_88._24_8_ = local_88 + 8;
      local_88._8_4_ = _S_red;
      dindex = 0;
      local_88._16_8_ = 0;
      local_60 = 0;
      paVar1 = &local_c8.field_2;
      local_68 = (_Base_ptr)local_88._24_8_;
      while( true ) {
        uVar5 = cmsys::Directory::GetNumberOfFiles(&local_d0);
        if (uVar5 <= dindex) break;
        pcVar6 = cmsys::Directory::GetFile(&local_d0,dindex);
        if ((*pcVar6 != '.') || (pcVar6[1] != '\0')) {
          pcVar6 = cmsys::Directory::GetFile(&local_d0,dindex);
          if ((*pcVar6 != '.') || ((pcVar6[1] != '.' || (pcVar6[2] != '\0')))) {
            pcVar6 = cmsys::Directory::GetFile(&local_d0,dindex);
            std::__cxx11::string::string((string *)&local_c8,pcVar6,(allocator *)&local_a8);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_88,&local_c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._M_dataplus._M_p != paVar1) {
              operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
            }
            if (iVar7._M_node == (_Base_ptr)(local_88 + 8)) {
              pcVar6 = cmsys::Directory::GetFile(&local_d0,dindex);
              std::__cxx11::string::string((string *)&local_c8,pcVar6,(allocator *)&local_a8);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)local_88,&local_c8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
              local_c8._M_dataplus._M_p = (pointer)paVar1;
              sVar3 = strlen(binDir);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_c8,binDir,binDir + sVar3);
              std::__cxx11::string::append((char *)&local_c8);
              cmsys::Directory::GetFile(&local_d0,dindex);
              std::__cxx11::string::append((char *)&local_c8);
              bVar2 = cmsys::SystemTools::FileIsDirectory(&local_c8);
              if (bVar2) {
                CleanupFiles(local_58,local_c8._M_dataplus._M_p);
                cmsys::SystemTools::RemoveADirectory(&local_c8);
              }
              else {
                bVar2 = cmsys::SystemTools::RemoveFile(&local_c8);
                if (!bVar2) {
                  std::operator+(&local_a8,"Remove failed on file: ",&local_c8);
                  cmSystemTools::ReportLastSystemError(local_a8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p,
                                    local_a8.field_2._M_allocated_capacity + 1);
                  }
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != paVar1) {
                operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1
                               );
              }
            }
          }
        }
        dindex = dindex + 1;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_88);
      cmsys::Directory::~Directory(&local_d0);
    }
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
  }
  return;
}

Assistant:

void cmCoreTryCompile::CleanupFiles(const char* binDir)
{
  if ( !binDir )
    {
    return;
    }

  std::string bdir = binDir;
  if(bdir.find("CMakeTmp") == std::string::npos)
    {
    cmSystemTools::Error(
      "TRY_COMPILE attempt to remove -rf directory that does not contain "
      "CMakeTmp:", binDir);
    return;
    }

  cmsys::Directory dir;
  dir.Load(binDir);
  size_t fileNum;
  std::set<std::string> deletedFiles;
  for (fileNum = 0; fileNum <  dir.GetNumberOfFiles(); ++fileNum)
    {
    if (strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".") &&
        strcmp(dir.GetFile(static_cast<unsigned long>(fileNum)),".."))
      {

      if(deletedFiles.find( dir.GetFile(static_cast<unsigned long>(fileNum)))
         == deletedFiles.end())
        {
        deletedFiles.insert(dir.GetFile(static_cast<unsigned long>(fileNum)));
        std::string fullPath = binDir;
        fullPath += "/";
        fullPath += dir.GetFile(static_cast<unsigned long>(fileNum));
        if(cmSystemTools::FileIsDirectory(fullPath))
          {
          this->CleanupFiles(fullPath.c_str());
          cmSystemTools::RemoveADirectory(fullPath);
          }
        else
          {
#ifdef _WIN32
          // Sometimes anti-virus software hangs on to new files so we
          // cannot delete them immediately.  Try a few times.
          cmSystemTools::WindowsFileRetry retry =
            cmSystemTools::GetWindowsFileRetry();
          while(!cmSystemTools::RemoveFile(fullPath.c_str()) &&
                --retry.Count && cmSystemTools::FileExists(fullPath.c_str()))
            {
            cmSystemTools::Delay(retry.Delay);
            }
          if(retry.Count == 0)
#else
          if(!cmSystemTools::RemoveFile(fullPath))
#endif
            {
            std::string m = "Remove failed on file: " + fullPath;
            cmSystemTools::ReportLastSystemError(m.c_str());
            }
          }
        }
      }
    }
}